

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_luma_subsampling_422_lbd_c
               (uint8_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  int i;
  int j;
  int height_local;
  int width_local;
  uint16_t *output_q3_local;
  int input_stride_local;
  uint8_t *input_local;
  
  output_q3_local = output_q3;
  input_local = input;
  for (j = 0; j < height; j = j + 1) {
    for (i = 0; i < width; i = i + 2) {
      output_q3_local[i >> 1] = ((ushort)input_local[i] + (ushort)input_local[i + 1]) * 4;
    }
    input_local = input_local + input_stride;
    output_q3_local = output_q3_local + 0x20;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_422_lbd_c(const uint8_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  assert((height - 1) * CFL_BUF_LINE + width <= CFL_BUF_SQUARE);
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i += 2) {
      output_q3[i >> 1] = (input[i] + input[i + 1]) << 2;
    }
    input += input_stride;
    output_q3 += CFL_BUF_LINE;
  }
}